

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QREncoder.cpp
# Opt level: O2

Version * ZXing::QRCode::RecommendVersion
                    (ErrorCorrectionLevel ecLevel,CodecMode mode,BitArray *headerBits,
                    BitArray *dataBits)

{
  int iVar1;
  Version *pVVar2;
  
  pVVar2 = Version::Model2(1);
  iVar1 = CalculateBitsNeeded(mode,headerBits,dataBits,pVVar2);
  pVVar2 = ChooseVersion(iVar1,ecLevel);
  iVar1 = CalculateBitsNeeded(mode,headerBits,dataBits,pVVar2);
  pVVar2 = ChooseVersion(iVar1,ecLevel);
  return pVVar2;
}

Assistant:

static const Version& RecommendVersion(ErrorCorrectionLevel ecLevel, CodecMode mode, const BitArray& headerBits, const BitArray& dataBits)
{
	// Hard part: need to know version to know how many bits length takes. But need to know how many
	// bits it takes to know version. First we take a guess at version by assuming version will be
	// the minimum, 1:
	int provisionalBitsNeeded = CalculateBitsNeeded(mode, headerBits, dataBits, *Version::Model2(1));
	const Version& provisionalVersion = ChooseVersion(provisionalBitsNeeded, ecLevel);

	// Use that guess to calculate the right version. I am still not sure this works in 100% of cases.
	int bitsNeeded = CalculateBitsNeeded(mode, headerBits, dataBits, provisionalVersion);
	return ChooseVersion(bitsNeeded, ecLevel);
}